

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

void Mean16x4_C(uint8_t *ref,uint32_t *dc)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  undefined1 auVar6 [13];
  long lVar7;
  long lVar8;
  uint32_t avg;
  uint32_t uVar9;
  
  lVar7 = 0;
  do {
    lVar8 = 0;
    uVar9 = 0;
    do {
      uVar1 = *(undefined4 *)(ref + lVar8);
      uVar5 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar5;
      auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar3[8] = (char)((uint)uVar1 >> 0x10);
      auVar3._0_8_ = uVar5;
      auVar3[9] = 0;
      auVar3._10_3_ = auVar2._10_3_;
      auVar6._5_8_ = 0;
      auVar6._0_5_ = auVar3._8_5_;
      auVar4[4] = (char)((uint)uVar1 >> 8);
      auVar4._0_4_ = (int)uVar5;
      auVar4[5] = 0;
      auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
      uVar9 = (uint)(uint3)(auVar2._10_3_ >> 0x10) + auVar4._4_4_ +
              auVar3._8_4_ + (int)uVar5 + uVar9;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x80);
    dc[lVar7] = uVar9;
    ref = ref + 4;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  return;
}

Assistant:

static void Mean16x4_C(const uint8_t* ref, uint32_t dc[4]) {
  int k, x, y;
  for (k = 0; k < 4; ++k) {
    uint32_t avg = 0;
    for (y = 0; y < 4; ++y) {
      for (x = 0; x < 4; ++x) {
        avg += ref[x + y * BPS];
      }
    }
    dc[k] = avg;
    ref += 4;   // go to next 4x4 block.
  }
}